

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_new_string8(JSContext *ctx,uint8_t *buf,int len)

{
  JSValueUnion JVar1;
  JSValue JVar2;
  
  if (len < 1) {
    JVar2 = JS_AtomToString(ctx,0x2f);
  }
  else {
    JVar1.ptr = js_alloc_string(ctx,len,0);
    if ((JSString *)JVar1.ptr == (JSString *)0x0) {
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
    }
    else {
      memcpy((JSString *)((long)JVar1.ptr + 0x10),buf,(ulong)(uint)len);
      *(undefined1 *)((long)JVar1.ptr + (ulong)(uint)len + 0x10) = 0;
      JVar2.tag = -7;
      JVar2.u.ptr = JVar1.ptr;
    }
  }
  return JVar2;
}

Assistant:

static JSValue js_new_string8(JSContext *ctx, const uint8_t *buf, int len)
{
    JSString *str;

    if (len <= 0) {
        return JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    str = js_alloc_string(ctx, len, 0);
    if (!str)
        return JS_EXCEPTION;
    memcpy(str->u.str8, buf, len);
    str->u.str8[len] = '\0';
    return JS_MKPTR(JS_TAG_STRING, str);
}